

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall mocker::Lexer::punct(Lexer *this,string *curTok)

{
  undefined1 *puVar1;
  char *pcVar2;
  long lVar3;
  LexError *this_00;
  TokenID TVar4;
  anon_class_8_1_8991fb9c local_20;
  anon_class_8_1_8991fb9c add;
  string *curTok_local;
  Lexer *this_local;
  
  local_20.this = this;
  add.this = (Lexer *)curTok;
  puVar1 = (undefined1 *)std::__cxx11::string::operator[]((ulong)curTok);
  switch(*puVar1) {
  case 0x21:
    lVar3 = std::__cxx11::string::size();
    TVar4 = NotEqual;
    if (lVar3 == 1) {
      TVar4 = LogicalNot;
    }
    punct::anon_class_8_1_8991fb9c::operator()(&local_20,TVar4);
    break;
  default:
    this_00 = (LexError *)__cxa_allocate_exception(0x48);
    LexError::LexError(this_00,this->curPos,this->nxtPos);
    __cxa_throw(this_00,&LexError::typeinfo,LexError::~LexError);
  case 0x25:
    punct::anon_class_8_1_8991fb9c::operator()(&local_20,Mod);
    break;
  case 0x26:
    lVar3 = std::__cxx11::string::size();
    TVar4 = LogicalAnd;
    if (lVar3 == 1) {
      TVar4 = BitAnd;
    }
    punct::anon_class_8_1_8991fb9c::operator()(&local_20,TVar4);
    break;
  case 0x28:
    punct::anon_class_8_1_8991fb9c::operator()(&local_20,LeftParen);
    break;
  case 0x29:
    punct::anon_class_8_1_8991fb9c::operator()(&local_20,RightParen);
    break;
  case 0x2a:
    punct::anon_class_8_1_8991fb9c::operator()(&local_20,Mult);
    break;
  case 0x2b:
    lVar3 = std::__cxx11::string::size();
    TVar4 = Plus;
    if (lVar3 == 2) {
      TVar4 = PlusPlus;
    }
    punct::anon_class_8_1_8991fb9c::operator()(&local_20,TVar4);
    break;
  case 0x2c:
    punct::anon_class_8_1_8991fb9c::operator()(&local_20,Comma);
    break;
  case 0x2d:
    lVar3 = std::__cxx11::string::size();
    TVar4 = Minus;
    if (lVar3 == 2) {
      TVar4 = MinusMinus;
    }
    punct::anon_class_8_1_8991fb9c::operator()(&local_20,TVar4);
    break;
  case 0x2e:
    punct::anon_class_8_1_8991fb9c::operator()(&local_20,Dot);
    break;
  case 0x2f:
    punct::anon_class_8_1_8991fb9c::operator()(&local_20,Divide);
    break;
  case 0x3b:
    punct::anon_class_8_1_8991fb9c::operator()(&local_20,Semicolon);
    break;
  case 0x3c:
    lVar3 = std::__cxx11::string::size();
    if (lVar3 == 1) {
      punct::anon_class_8_1_8991fb9c::operator()(&local_20,LessThan);
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)add.this);
      TVar4 = LeftShift;
      if (*pcVar2 == '=') {
        TVar4 = LessEqual;
      }
      punct::anon_class_8_1_8991fb9c::operator()(&local_20,TVar4);
    }
    break;
  case 0x3d:
    lVar3 = std::__cxx11::string::size();
    TVar4 = Equal;
    if (lVar3 == 1) {
      TVar4 = Assign;
    }
    punct::anon_class_8_1_8991fb9c::operator()(&local_20,TVar4);
    break;
  case 0x3e:
    lVar3 = std::__cxx11::string::size();
    if (lVar3 == 1) {
      punct::anon_class_8_1_8991fb9c::operator()(&local_20,GreaterThan);
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)add.this);
      TVar4 = RightShift;
      if (*pcVar2 == '=') {
        TVar4 = GreaterEqual;
      }
      punct::anon_class_8_1_8991fb9c::operator()(&local_20,TVar4);
    }
    break;
  case 0x5b:
    punct::anon_class_8_1_8991fb9c::operator()(&local_20,LeftBracket);
    break;
  case 0x5d:
    punct::anon_class_8_1_8991fb9c::operator()(&local_20,RightBracket);
    break;
  case 0x5e:
    punct::anon_class_8_1_8991fb9c::operator()(&local_20,BitXor);
    break;
  case 0x7b:
    punct::anon_class_8_1_8991fb9c::operator()(&local_20,LeftBrace);
    break;
  case 0x7c:
    lVar3 = std::__cxx11::string::size();
    TVar4 = LogicalOr;
    if (lVar3 == 1) {
      TVar4 = BitOr;
    }
    punct::anon_class_8_1_8991fb9c::operator()(&local_20,TVar4);
    break;
  case 0x7d:
    punct::anon_class_8_1_8991fb9c::operator()(&local_20,RightBrace);
    break;
  case 0x7e:
    punct::anon_class_8_1_8991fb9c::operator()(&local_20,BitNot);
  }
  return;
}

Assistant:

void Lexer::punct(const std::string &curTok) {
  auto add = [this](TokenID id) { tokens.emplace_back(id, curPos, nxtPos); };
  switch (curTok[0]) {
  case '(':
    MOCKER_ADD(TokenID::LeftParen);
  case ')':
    MOCKER_ADD(TokenID::RightParen);
  case '[':
    MOCKER_ADD(TokenID::LeftBracket);
  case ']':
    MOCKER_ADD(TokenID::RightBracket);
  case '{':
    MOCKER_ADD(TokenID::LeftBrace);
  case '}':
    MOCKER_ADD(TokenID::RightBrace);
  case ';':
    MOCKER_ADD(TokenID::Semicolon);
  case ',':
    MOCKER_ADD(TokenID::Comma);
  case '+':
    add(curTok.size() == 2 ? TokenID::PlusPlus : TokenID::Plus);
    break;
  case '-':
    add(curTok.size() == 2 ? TokenID::MinusMinus : TokenID::Minus);
    break;
  case '*':
    MOCKER_ADD(TokenID::Mult);
  case '/':
    MOCKER_ADD(TokenID::Divide);
  case '%':
    MOCKER_ADD(TokenID::Mod);
  case '>':
    if (curTok.size() == 1) {
      add(TokenID::GreaterThan);
      break;
    }
    add(curTok[1] == '=' ? TokenID::GreaterEqual : TokenID::RightShift);
    break;
  case '<':
    if (curTok.size() == 1) {
      add(TokenID::LessThan);
      break;
    }
    add(curTok[1] == '=' ? TokenID::LessEqual : TokenID::LeftShift);
    break;
  case '=':
    add(curTok.size() == 1 ? TokenID::Assign : TokenID::Equal);
    break;
  case '!':
    add(curTok.size() == 1 ? TokenID::LogicalNot : TokenID::NotEqual);
    break;
  case '&':
    add(curTok.size() == 1 ? TokenID::BitAnd : TokenID::LogicalAnd);
    break;
  case '|':
    add(curTok.size() == 1 ? TokenID::BitOr : TokenID::LogicalOr);
    break;
  case '~':
    MOCKER_ADD(TokenID::BitNot);
  case '^':
    MOCKER_ADD(TokenID::BitXor);
  case '.':
    MOCKER_ADD(TokenID::Dot);
  default:
    throw LexError(curPos, nxtPos);
  }
}